

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O2

void __thiscall QDBusListener::loadJson(QDBusListener *this,QString *fileName)

{
  char cVar1;
  bool bVar2;
  Provider PVar3;
  Setting SVar4;
  long lVar5;
  QDebug *pQVar6;
  bool *pbVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  const_iterator cVar9;
  QMetaEnum QVar10;
  QLatin1StringView t;
  QLatin1StringView t_00;
  QLatin1StringView t_01;
  QLatin1StringView t_02;
  qsizetype qStack_150;
  bool success;
  undefined3 uStack_137;
  Setting local_134;
  QArrayDataPointer<char16_t> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_100;
  QArrayDataPointer<char16_t> local_e8;
  QJsonObject local_d0 [8];
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_c8;
  ulong local_c0;
  QJsonArray local_b8 [8];
  QJsonObject local_b0 [8];
  QJsonDocument doc;
  undefined1 *local_98;
  undefined1 *puStack_90;
  pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
  local_88;
  char *local_70;
  DBusKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_98,(QString *)fileName);
  cVar1 = QFile::exists();
  if (cVar1 == '\0') {
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
       ) goto LAB_0059c27d;
    local_68.location.d.d._0_4_ = 2;
    local_68.location.d.d._4_4_ = 0;
    local_68.location.d.ptr._0_4_ = 0;
    local_68.location.d.ptr._4_4_ = 0;
    local_68.location.d.size._0_4_ = 0;
    local_68.location.d.size._4_4_ = 0;
    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
    QMessageLogger::warning();
    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
    pQVar6 = QDebug::operator<<(pQVar6,fileName);
    pcVar8 = "doesn\'t exist.";
  }
  else {
    cVar1 = QFile::open(&local_98,1);
    if (cVar1 != '\0') {
      _doc = &DAT_aaaaaaaaaaaaaaaa;
      QIODevice::readAll();
      QJsonDocument::fromJson((QByteArray *)&doc,(QJsonParseError *)&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
      cVar1 = QJsonDocument::isObject();
      if (cVar1 == '\0') {
        lcQpaThemeDBus();
        if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_68.location.d.d._0_4_ = 2;
          local_68.location.d.d._4_4_ = 0;
          local_68.location.d.ptr._0_4_ = 0;
          local_68.location.d.ptr._4_4_ = 0;
          local_68.location.d.size._0_4_ = 0;
          local_68.location.d.size._4_4_ = 0;
          local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
          QMessageLogger::warning();
          pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
          pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected root object");
          t.m_data = "Q_L1.qpa.DBusSignals";
          t.m_size = 0x14;
          pQVar6 = QDebug::operator<<(pQVar6,t);
          QDebug::operator<<(pQVar6,"Falling back to default.");
          QDebug::~QDebug((QDebug *)&local_88);
        }
      }
      else {
        QJsonDocument::object();
        cVar1 = QJsonObject::contains((QLatin1String *)local_b0);
        if (cVar1 == '\0') {
          lcQpaThemeDBus();
          if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1
              ) != 0) {
            local_68.location.d.d._0_4_ = 2;
            local_68.location.d.d._4_4_ = 0;
            local_68.location.d.ptr._0_4_ = 0;
            local_68.location.d.ptr._4_4_ = 0;
            local_68.location.d.size._0_4_ = 0;
            local_68.location.d.size._4_4_ = 0;
            local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
            QMessageLogger::warning();
            pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
            pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expectned root object");
            pcVar8 = "Q_L1.qpa.DBusSignals";
            qStack_150 = 0x14;
LAB_0059be28:
            t_00.m_data = pcVar8;
            t_00.m_size = qStack_150;
            pQVar6 = QDebug::operator<<(pQVar6,t_00);
            QDebug::operator<<(pQVar6,"Falling back to default.");
            QDebug::~QDebug((QDebug *)&local_88);
          }
        }
        else {
          QJsonObject::value((QLatin1String *)&local_88);
          QJsonValue::operator[]((QLatin1String *)&local_68);
          bVar2 = QJsonValue::isArray((QJsonValue *)&local_68);
          QJsonValue::~QJsonValue((QJsonValue *)&local_68);
          QJsonValue::~QJsonValue((QJsonValue *)&local_88);
          if (bVar2) {
            QJsonObject::value((QLatin1String *)&local_88);
            QJsonValue::operator[]((QLatin1String *)&local_68);
            QJsonValue::toArray();
            QJsonValue::~QJsonValue((QJsonValue *)&local_68);
            QJsonValue::~QJsonValue((QJsonValue *)&local_88);
            lVar5 = QJsonArray::size();
            if (lVar5 < 1) {
              lcQpaThemeDBus();
              if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                  & 1) != 0) {
                local_68.location.d.d._0_4_ = 2;
                local_68.location.d.d._4_4_ = 0;
                local_68.location.d.ptr._0_4_ = 0;
                local_68.location.d.ptr._4_4_ = 0;
                local_68.location.d.size._0_4_ = 0;
                local_68.location.d.size._4_4_ = 0;
                local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                QMessageLogger::warning();
                pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                pcVar8 = "Parse Error: Found empty array";
LAB_0059bea6:
                pQVar6 = QDebug::operator<<(pQVar6,pcVar8);
                t_01.m_data = "DbusSignals";
                t_01.m_size = 0xb;
                pQVar6 = QDebug::operator<<(pQVar6,t_01);
                pcVar8 = "Falling back to default.";
LAB_0059bec7:
                QDebug::operator<<(pQVar6,pcVar8);
LAB_0059bf3f:
                QDebug::~QDebug((QDebug *)&local_88);
              }
            }
            else {
              local_c0 = 0;
              local_c8.a = local_b8;
              while( true ) {
                cVar9 = QJsonArray::constEnd(local_b8);
                if ((local_c8.a == cVar9.item.field_0.a) && ((cVar9.item._8_8_ ^ local_c0) < 2)) {
                  lVar5 = (this->m_signalMap).c.keys.d.size;
                  lcQpaThemeDBus();
                  if (lVar5 == 0) {
                    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value.
                               _M_base._M_i & 1) != 0) {
                      local_68.location.d.d._0_4_ = 2;
                      local_68.location.d.d._4_4_ = 0;
                      local_68.location.d.ptr._0_4_ = 0;
                      local_68.location.d.ptr._4_4_ = 0;
                      local_68.location.d.size._0_4_ = 0;
                      local_68.location.d.size._4_4_ = 0;
                      local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                      QMessageLogger::warning();
                      pQVar6 = QDebug::operator<<((QDebug *)&local_88,"No data imported from");
                      pQVar6 = QDebug::operator<<(pQVar6,fileName);
                      pcVar8 = "falling back to default.";
                      goto LAB_0059bec7;
                    }
                  }
                  else if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledInfo._q_value.
                                  _M_base._M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::info();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,"Successfully imported");
                    QDebug::operator<<(pQVar6,fileName);
                    goto LAB_0059bf3f;
                  }
                  goto LAB_0059c256;
                }
                bVar2 = QJsonValueConstRef::isObject((QJsonValueConstRef *)&local_c8);
                if (!bVar2) {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pcVar8 = "Parse Error: Expected object array";
                    goto LAB_0059bea6;
                  }
                  goto LAB_0059c256;
                }
                QJsonValueConstRef::toObject();
                cVar1 = QJsonObject::contains((QLatin1String *)local_d0);
                if (cVar1 == '\0') break;
                cVar1 = QJsonObject::contains((QLatin1String *)local_d0);
                if (cVar1 == '\0') {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected key");
                    pcVar8 = "DBusKey";
LAB_0059c15a:
                    qStack_150 = 7;
                    goto LAB_0059c15c;
                  }
                  goto LAB_0059c24c;
                }
                cVar1 = QJsonObject::contains((QLatin1String *)local_d0);
                if (cVar1 == '\0') {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected key");
                    pcVar8 = "Provider";
                    qStack_150 = 8;
                    goto LAB_0059c15c;
                  }
                  goto LAB_0059c24c;
                }
                cVar1 = QJsonObject::contains((QLatin1String *)local_d0);
                if (cVar1 == '\0') {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected key");
                    pcVar8 = "Setting";
                    goto LAB_0059c15a;
                  }
                  goto LAB_0059c24c;
                }
                QJsonObject::value((QLatin1String *)&local_68);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                QJsonObject::value((QLatin1String *)&local_68);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                QJsonObject::value((QLatin1String *)&local_68);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                QJsonObject::value((QLatin1String *)&local_68);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)&local_68);
                _success = CONCAT31(uStack_137,0xaa);
                QVar10 = QMetaEnum::fromType<QDBusListener::Provider>();
                local_88.first.c._0_4_ = QVar10.mobj._0_4_;
                local_88.first._4_8_ = QVar10._4_8_;
                local_88.first.i._4_4_ = QVar10.data.d._4_4_;
                QString::toLatin1_helper((QString *)&local_68);
                pbVar7 = (bool *)CONCAT44(local_68.location.d.ptr._4_4_,
                                          local_68.location.d.ptr._0_4_);
                if (pbVar7 == (bool *)0x0) {
                  pbVar7 = (bool *)&QByteArray::_empty;
                }
                PVar3 = QMetaEnum::keyToValue((char *)&local_88,pbVar7);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
                if (success == false) {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Invalid value");
                    pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_118);
                    pQVar6 = QDebug::operator<<(pQVar6,"for");
                    pcVar8 = "provider";
LAB_0059c38f:
                    pQVar6 = QDebug::operator<<(pQVar6,pcVar8);
                    QDebug::operator<<(pQVar6,"Falling back to default.");
                    QDebug::~QDebug((QDebug *)&local_88);
                  }
LAB_0059c224:
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
                  goto LAB_0059c24c;
                }
                _success = CONCAT31(uStack_137,0xaa);
                QVar10 = QMetaEnum::fromType<QDBusListener::Setting>();
                local_88.first.c._0_4_ = QVar10.mobj._0_4_;
                local_88.first._4_8_ = QVar10._4_8_;
                local_88.first.i._4_4_ = QVar10.data.d._4_4_;
                QString::toLatin1_helper((QString *)&local_68);
                pbVar7 = (bool *)CONCAT44(local_68.location.d.ptr._4_4_,
                                          local_68.location.d.ptr._0_4_);
                if (pbVar7 == (bool *)0x0) {
                  pbVar7 = (bool *)&QByteArray::_empty;
                }
                SVar4 = QMetaEnum::keyToValue((char *)&local_88,pbVar7);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
                if (success == false) {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_68.location.d.d._0_4_ = 2;
                    local_68.location.d.d._4_4_ = 0;
                    local_68.location.d.ptr._0_4_ = 0;
                    local_68.location.d.ptr._4_4_ = 0;
                    local_68.location.d.size._0_4_ = 0;
                    local_68.location.d.size._4_4_ = 0;
                    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Invalid value");
                    pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_130);
                    pQVar6 = QDebug::operator<<(pQVar6,"for");
                    pcVar8 = "setting";
                    goto LAB_0059c38f;
                  }
                  goto LAB_0059c224;
                }
                local_68.key.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                local_68.key.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_68.location.d.size._0_4_ = 0xaaaaaaaa;
                local_68.location.d.size._4_4_ = 0xaaaaaaaa;
                local_68.key.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_68.location.d.d._0_4_ = 0xaaaaaaaa;
                local_68.location.d.d._4_4_ = 0xaaaaaaaa;
                local_68.location.d.ptr._0_4_ = 0xaaaaaaaa;
                local_68.location.d.ptr._4_4_ = 0xaaaaaaaa;
                DBusKey::DBusKey(&local_68,(QString *)&local_e8,(QString *)&local_100);
                bVar2 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                        ::contains(&this->m_signalMap,&local_68);
                if (bVar2) {
                  lcQpaThemeDBus();
                  if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base.
                             _M_i & 1) != 0) {
                    local_88.first.c._0_4_ = 2;
                    local_88.first._4_8_ = 0;
                    local_88.first.i._4_4_ = 0;
                    local_88.second = false;
                    local_88._17_3_ = 0;
                    local_88._20_4_ = 0;
                    local_70 = lcQpaThemeDBus::category.name;
                    QMessageLogger::warning();
                    pQVar6 = QDebug::operator<<((QDebug *)&success,fileName);
                    pQVar6 = QDebug::operator<<(pQVar6,"Duplicate key");
                    pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_e8);
                    pQVar6 = QDebug::operator<<(pQVar6,(QString *)&local_100);
                    QDebug::operator<<(pQVar6,"Falling back to default.");
                    QDebug::~QDebug((QDebug *)&success);
                  }
                }
                else {
                  _success = PVar3;
                  local_134 = SVar4;
                  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                  ::try_emplace<QDBusListener::ChangeSignal>
                            (&local_88,&this->m_signalMap,&local_68,(ChangeSignal *)&success);
                }
                DBusKey::~DBusKey(&local_68);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
                QJsonObject::~QJsonObject(local_d0);
                if (bVar2) goto LAB_0059c256;
                local_c0 = local_c0 + 2;
              }
              lcQpaThemeDBus();
              if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                  & 1) != 0) {
                local_68.location.d.d._0_4_ = 2;
                local_68.location.d.d._4_4_ = 0;
                local_68.location.d.ptr._0_4_ = 0;
                local_68.location.d.ptr._4_4_ = 0;
                local_68.location.d.size._0_4_ = 0;
                local_68.location.d.size._4_4_ = 0;
                local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
                QMessageLogger::warning();
                pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
                pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected key");
                pcVar8 = "DBusLocation";
                qStack_150 = 0xc;
LAB_0059c15c:
                t_02.m_data = pcVar8;
                t_02.m_size = qStack_150;
                pQVar6 = QDebug::operator<<(pQVar6,t_02);
                QDebug::operator<<(pQVar6,"Falling back to default.");
                QDebug::~QDebug((QDebug *)&local_88);
              }
LAB_0059c24c:
              QJsonObject::~QJsonObject(local_d0);
            }
LAB_0059c256:
            QJsonArray::~QJsonArray(local_b8);
          }
          else {
            lcQpaThemeDBus();
            if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                1) != 0) {
              local_68.location.d.d._0_4_ = 2;
              local_68.location.d.d._4_4_ = 0;
              local_68.location.d.ptr._0_4_ = 0;
              local_68.location.d.ptr._4_4_ = 0;
              local_68.location.d.size._0_4_ = 0;
              local_68.location.d.size._4_4_ = 0;
              local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
              QMessageLogger::warning();
              pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
              pQVar6 = QDebug::operator<<(pQVar6,"Parse Error: Expected array");
              pcVar8 = "DbusSignals";
              qStack_150 = 0xb;
              goto LAB_0059be28;
            }
          }
        }
        QJsonObject::~QJsonObject(local_b0);
      }
      QJsonDocument::~QJsonDocument(&doc);
      goto LAB_0059c27d;
    }
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
       ) goto LAB_0059c27d;
    local_68.location.d.d._0_4_ = 2;
    local_68.location.d.d._4_4_ = 0;
    local_68.location.d.ptr._0_4_ = 0;
    local_68.location.d.ptr._4_4_ = 0;
    local_68.location.d.size._0_4_ = 0;
    local_68.location.d.size._4_4_ = 0;
    local_68.key.d.d = (Data *)lcQpaThemeDBus::category.name;
    QMessageLogger::warning();
    pQVar6 = QDebug::operator<<((QDebug *)&local_88,fileName);
    pcVar8 = "could not be opened for reading.";
  }
  pQVar6 = QDebug::operator<<(pQVar6,pcVar8);
  QDebug::operator<<(pQVar6,"Falling back to default.");
  QDebug::~QDebug((QDebug *)&local_88);
LAB_0059c27d:
  QFile::~QFile((QFile *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusListener::loadJson(const QString &fileName)
{
    Q_ASSERT(!fileName.isEmpty());
#define CHECK(cond, warning)\
    if (!cond) {\
        qCWarning(lcQpaThemeDBus) << fileName << warning << "Falling back to default.";\
        return;\
    }

#define PARSE(var, enumeration, string)\
    enumeration var;\
    {\
        bool success;\
        const int val = QMetaEnum::fromType<enumeration>().keyToValue(string.toLatin1(), &success);\
        CHECK(success, "Parse Error: Invalid value" << string << "for" << #var);\
        var = static_cast<enumeration>(val);\
    }

    QFile file(fileName);
    CHECK(file.exists(), fileName << "doesn't exist.");
    CHECK(file.open(QIODevice::ReadOnly), "could not be opened for reading.");

    QJsonParseError error;
    QJsonDocument doc = QJsonDocument::fromJson(file.readAll(), &error);
    CHECK((error.error == QJsonParseError::NoError), error.errorString());
    CHECK(doc.isObject(), "Parse Error: Expected root object" << JsonKeys::root());

    const QJsonObject &root = doc.object();
    CHECK(root.contains(JsonKeys::root()), "Parse Error: Expectned root object" << JsonKeys::root());
    CHECK(root[JsonKeys::root()][JsonKeys::dbusSignals()].isArray(), "Parse Error: Expected array" << JsonKeys::dbusSignals());

    const QJsonArray &sigs = root[JsonKeys::root()][JsonKeys::dbusSignals()].toArray();
    CHECK((sigs.count() > 0), "Parse Error: Found empty array" << JsonKeys::dbusSignals());

    for (auto sig = sigs.constBegin(); sig != sigs.constEnd(); ++sig) {
        CHECK(sig->isObject(), "Parse Error: Expected object array" << JsonKeys::dbusSignals());
        const QJsonObject &obj = sig->toObject();
        CHECK(obj.contains(JsonKeys::dbusLocation()), "Parse Error: Expected key" << JsonKeys::dbusLocation());
        CHECK(obj.contains(JsonKeys::dbusKey()), "Parse Error: Expected key" << JsonKeys::dbusKey());
        CHECK(obj.contains(JsonKeys::provider()), "Parse Error: Expected key" << JsonKeys::provider());
        CHECK(obj.contains(JsonKeys::setting()), "Parse Error: Expected key" << JsonKeys::setting());
        const QString &location = obj[JsonKeys::dbusLocation()].toString();
        const QString &key = obj[JsonKeys::dbusKey()].toString();
        const QString &providerString = obj[JsonKeys::provider()].toString();
        const QString &settingString = obj[JsonKeys::setting()].toString();
        PARSE(provider, Provider, providerString);
        PARSE(setting, Setting, settingString);
        const DBusKey dkey(location, key);
        CHECK (!m_signalMap.contains(dkey), "Duplicate key" << location << key);
        m_signalMap.insert(dkey, ChangeSignal(provider, setting));
    }
#undef PARSE
#undef CHECK

    if (m_signalMap.count() > 0)
        qCInfo(lcQpaThemeDBus) << "Successfully imported" << fileName;
    else
        qCWarning(lcQpaThemeDBus) << "No data imported from" << fileName << "falling back to default.";

#ifdef QT_DEBUG
    const int count = m_signalMap.count();
    if (count == 0)
        return;

    qCDebug(lcQpaThemeDBus) << "Listening to" << count << "signals:";
    for (auto it = m_signalMap.constBegin(); it != m_signalMap.constEnd(); ++it) {
        qDebug() << it.key().key << it.key().location << "mapped to"
                 << it.value().provider << it.value().setting;
    }

#endif
}